

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths_unix.cpp
# Opt level: O1

QStringList * dirsList(QStringList *__return_storage_ptr__,QString *xdgEnvVar)

{
  long in_FS_OFFSET;
  iterator __begin1;
  QString local_b8;
  QString local_a0;
  undefined1 local_88 [32];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QStringTokenizerBase<QStringView,_QChar> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_48.m_haystack.m_data = (xdgEnvVar->d).ptr;
  local_48.m_haystack.m_size = (xdgEnvVar->d).size;
  local_48.super_QStringTokenizerBaseBase.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
  super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
  local_48.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
  local_48.m_needle.ucs = L':';
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStringTokenizerBase<QStringView,_QChar>::iterator::iterator((iterator *)local_88,&local_48);
  if (local_88[0x18] == true) {
    do {
      if (((undefined1 *)local_88._8_8_ != (undefined1 *)0x0) &&
         (*(char16_t *)local_88._16_8_ == L'/')) {
        QString::QString(&local_b8,(QChar *)local_88._16_8_,local_88._8_8_);
        QDir::cleanPath(&local_a0,&local_b8);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_a0);
        QList<QString>::end(__return_storage_ptr__);
        if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      QStringTokenizerBase<QStringView,_QChar>::iterator::advance((iterator *)local_88);
    } while (local_88[0x18] != false);
  }
  QtPrivate::QStringList_removeDuplicates(__return_storage_ptr__);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QStringList dirsList(const QString &xdgEnvVar)
{
    QStringList dirs;
    // http://standards.freedesktop.org/basedir-spec/latest/
    // Normalize paths, skip relative paths (the spec says relative paths
    // should be ignored)
    for (const auto dir : qTokenize(xdgEnvVar, u':'))
        if (dir.startsWith(u'/'))
            dirs.push_back(QDir::cleanPath(dir.toString()));

    // Remove duplicates from the list, there's no use for duplicated paths
    // in XDG_* env vars - if whatever is being looked for is not found in
    // the given directory the first time, it won't be there the second time.
    // Plus duplicate paths causes problems for example for mimetypes,
    // where duplicate paths here lead to duplicated mime types returned
    // for a file, eg "text/plain,text/plain" instead of "text/plain"
    dirs.removeDuplicates();

    return dirs;
}